

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void * calloc(size_t __nmemb,size_t __size)

{
  _Bool _Var1;
  void *p;
  size_t size_local;
  size_t numelem_local;
  
  _Var1 = use_hdmp();
  if (_Var1) {
    hdbg.stats.calloc_calls = hdbg.stats.calloc_calls + 1;
    numelem_local = (size_t)malloc(__nmemb * __size);
    memset((void *)numelem_local,0,__nmemb * __size);
  }
  else {
    numelem_local = (size_t)(*real_calloc)(__nmemb,__size);
  }
  return (void *)numelem_local;
}

Assistant:

void *calloc(size_t numelem, size_t size) {
    if (!use_hdmp())
       return real_calloc(numelem, size);
    hdbg.stats.calloc_calls++;
    size *= numelem;
    void *p = malloc(size);
    memset(p, 0, size);
    return p;
}